

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int pushParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int local_58;
  int local_54;
  int chunkSize;
  int cur;
  int res;
  int size;
  char *base;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  char *pcStack_28;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  local_58 = 4;
  nb_tests = nb_tests + 1;
  ctxt._4_4_ = options;
  pcStack_28 = err;
  err_local = result;
  result_local = filename;
  iVar1 = loadMem(filename,(char **)&res,&cur);
  if (iVar1 == 0) {
    if (cur < 4) {
      local_58 = cur;
    }
    if ((ctxt._4_4_ & 0x1000000) == 0) {
      doc = (xmlDocPtr)xmlCreatePushParserCtxt(0,0,_res,local_58,result_local);
    }
    else {
      doc = (xmlDocPtr)htmlCreatePushParserCtxt(0,0,_res,local_58,result_local,0);
    }
    xmlCtxtUseOptions(doc,ctxt._4_4_);
    local_54 = local_58;
    do {
      if (cur <= local_54 + 0x400) {
        if ((ctxt._4_4_ & 0x1000000) == 0) {
          xmlParseChunk(doc,_res + local_54,cur - local_54,1);
        }
        else {
          htmlParseChunk(doc,_res + local_54,cur - local_54,1);
        }
        break;
      }
      if ((ctxt._4_4_ & 0x1000000) == 0) {
        xmlParseChunk(doc,_res + local_54,0x400,0);
      }
      else {
        htmlParseChunk(doc,_res + local_54,0x400);
      }
      local_54 = local_54 + 0x400;
    } while (local_54 < cur);
    base = doc->name;
    if ((ctxt._4_4_ & 0x1000000) == 0) {
      chunkSize = *(int *)&doc->children;
    }
    else {
      chunkSize = 1;
    }
    xmlFreeParserCtxt(doc);
    free(_res);
    if (chunkSize == 0) {
      xmlFreeDoc(base);
      fprintf(_stderr,"Failed to parse %s\n",result_local);
      filename_local._4_4_ = -1;
    }
    else {
      if ((ctxt._4_4_ & 0x1000000) == 0) {
        xmlDocDumpMemory(base,&res,&cur);
      }
      else {
        htmlDocDumpMemory(base,&res,&cur);
      }
      xmlFreeDoc(base);
      iVar1 = compareFileMem(err_local,_res,cur);
      if ((_res == (char *)0x0) || (iVar1 != 0)) {
        if (_res != (char *)0x0) {
          (*_xmlFree)(_res);
        }
        fprintf(_stderr,"Result for %s failed in %s\n",result_local,err_local);
        filename_local._4_4_ = -1;
      }
      else {
        (*_xmlFree)(_res);
        if ((pcStack_28 == (char *)0x0) ||
           (iVar1 = compareFileMem(pcStack_28,testErrors,testErrorsSize), iVar1 == 0)) {
          filename_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"Error for %s failed\n",result_local);
          filename_local._4_4_ = -1;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"Failed to load %s\n",result_local);
    filename_local._4_4_ = -1;
  }
  return filename_local._4_4_;
}

Assistant:

static int
pushParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    const char *base;
    int size, res;
    int cur = 0;
    int chunkSize = 4;

    nb_tests++;
    /*
     * load the document in memory and work from there.
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    if (chunkSize > size)
        chunkSize = size;

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	ctxt = htmlCreatePushParserCtxt(NULL, NULL, base + cur, chunkSize, filename,
	                                XML_CHAR_ENCODING_NONE);
    else
#endif
    ctxt = xmlCreatePushParserCtxt(NULL, NULL, base + cur, chunkSize, filename);
    xmlCtxtUseOptions(ctxt, options);
    cur += chunkSize;
    chunkSize = 1024;
    do {
        if (cur + chunkSize >= size) {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML)
		htmlParseChunk(ctxt, base + cur, size - cur, 1);
	    else
#endif
	    xmlParseChunk(ctxt, base + cur, size - cur, 1);
	    break;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML)
		htmlParseChunk(ctxt, base + cur, chunkSize, 0);
	    else
#endif
	    xmlParseChunk(ctxt, base + cur, chunkSize, 0);
	    cur += chunkSize;
	}
    } while (cur < size);
    doc = ctxt->myDoc;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
        res = 1;
    else
#endif
    res = ctxt->wellFormed;
    xmlFreeParserCtxt(ctxt);
    free((char *)base);
    if (!res) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    else
#endif
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    xmlFreeDoc(doc);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
	if (base != NULL)
	    xmlFree((char *)base);
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	return(-1);
    }
    xmlFree((char *)base);
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    }
    return(0);
}